

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest::BuildFile
          (DescriptorPoolTypeResolverSyntaxTest *this,string_view file_contents)

{
  FileDescriptor *pFVar1;
  LogMessage *pLVar2;
  LogMessage local_160;
  Voidify local_14d [13];
  FileDescriptor *local_140;
  FileDescriptor *file;
  char *pcStack_130;
  ParseTextOrDie local_128;
  undefined1 local_118 [8];
  FileDescriptorProto proto;
  DescriptorPoolTypeResolverSyntaxTest *this_local;
  string_view file_contents_local;
  
  pcStack_130 = file_contents._M_str;
  file = (FileDescriptor *)file_contents._M_len;
  proto.field_0._224_8_ = this;
  ParseTextOrDie::ParseTextOrDie(&local_128,file_contents);
  ParseTextOrDie::operator_cast_to_FileDescriptorProto((FileDescriptorProto *)local_118,&local_128);
  pFVar1 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_118);
  local_140 = pFVar1;
  if (pFVar1 != (FileDescriptor *)0x0) {
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
    return pFVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
             ,0x1ab,"file != nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_160);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_14d,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_160)
  ;
}

Assistant:

const FileDescriptor* BuildFile(absl::string_view file_contents) {
    FileDescriptorProto proto = ParseTextOrDie(file_contents);
    const FileDescriptor* file = pool_.BuildFile(proto);
    ABSL_CHECK(file != nullptr);
    return file;
  }